

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_codeptr.cpp
# Opt level: O3

int AF_A_JumpIfMasterCloser
              (VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  PClass *pPVar1;
  int iVar2;
  PClass *pPVar3;
  char *__assertion;
  AActor *target;
  int in_R9D;
  undefined8 *puVar4;
  bool bVar5;
  
  pPVar1 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_0066bd88;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_0066bd78:
    __assertion = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_0066bd88:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_codeptr.cpp"
                  ,0x50a,
                  "int AF_A_JumpIfMasterCloser(VMFrameStack *, VMValue *, int, VMReturn *, int)");
  }
  puVar4 = (undefined8 *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (puVar4 == (undefined8 *)0x0) goto LAB_0066bd36;
    pPVar3 = (PClass *)puVar4[1];
    if (pPVar3 == (PClass *)0x0) {
      pPVar3 = (PClass *)(**(code **)*puVar4)(puVar4);
      puVar4[1] = pPVar3;
    }
    bVar5 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar5) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar5 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar5) {
      __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
      goto LAB_0066bd88;
    }
  }
  else {
    if (puVar4 != (undefined8 *)0x0) goto LAB_0066bd78;
LAB_0066bd36:
    puVar4 = (undefined8 *)0x0;
  }
  target = (AActor *)puVar4[0x4a];
  if (target != (AActor *)0x0) {
    if (((target->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) goto LAB_0066bd5a;
    puVar4[0x4a] = 0;
  }
  target = (AActor *)0x0;
LAB_0066bd5a:
  iVar2 = DoJumpIfCloser(target,(VMFrameStack *)param,(VMValue *)(ulong)(uint)numparam,(int)ret,
                         (VMReturn *)(ulong)(uint)numret,in_R9D);
  return iVar2;
}

Assistant:

DEFINE_ACTION_FUNCTION_PARAMS(AActor, A_JumpIfMasterCloser)
{
	PARAM_SELF_PROLOGUE(AActor);
	return DoJumpIfCloser(self->master, VM_ARGS_NAMES);
}